

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_pyr_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [5];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  _node = 0x100000000;
  nodes[0] = 2;
  nodes[1] = 3;
  nodes[2] = 4;
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    unique0x00012000 = pRVar1->node;
    ref_grid_ptr_local._4_4_ = ref_node_add(unique0x00012000,0,&ref_private_macro_code_rss_1);
    if (ref_grid_ptr_local._4_4_ == 0) {
      stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
      stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
      stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
      ref_grid_ptr_local._4_4_ =
           ref_node_add(stack0xffffffffffffffd0,1,&ref_private_macro_code_rss_1);
      if (ref_grid_ptr_local._4_4_ == 0) {
        stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
        stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
        stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
        ref_grid_ptr_local._4_4_ =
             ref_node_add(stack0xffffffffffffffd0,2,&ref_private_macro_code_rss_1);
        if (ref_grid_ptr_local._4_4_ == 0) {
          stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
          stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 1] = 1.0;
          stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
          ref_grid_ptr_local._4_4_ =
               ref_node_add(stack0xffffffffffffffd0,3,&ref_private_macro_code_rss_1);
          if (ref_grid_ptr_local._4_4_ == 0) {
            stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
            stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
            stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
            ref_grid_ptr_local._4_4_ =
                 ref_node_add(stack0xffffffffffffffd0,4,&ref_private_macro_code_rss_1);
            if (ref_grid_ptr_local._4_4_ == 0) {
              stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
              stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
              stack0xffffffffffffffd0->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
              ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(stack0xffffffffffffffd0,5);
              if (ref_grid_ptr_local._4_4_ == 0) {
                ref_grid_ptr_local._4_4_ =
                     ref_cell_add(pRVar1->cell[9],&node,&ref_private_macro_code_rss);
                if (ref_grid_ptr_local._4_4_ == 0) {
                  _node = 0x300000000;
                  nodes[0] = 4;
                  nodes[1] = 1;
                  nodes[2] = 10;
                  ref_grid_ptr_local._4_4_ =
                       ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                  if (ref_grid_ptr_local._4_4_ == 0) {
                    _node = 0x100000000;
                    nodes[0] = 2;
                    nodes[1] = 0x14;
                    ref_grid_ptr_local._4_4_ =
                         ref_cell_add(pRVar1->cell[3],&node,&ref_private_macro_code_rss);
                    if (ref_grid_ptr_local._4_4_ == 0) {
                      _node = 0x400000001;
                      nodes[0] = 2;
                      nodes[1] = 0x14;
                      ref_grid_ptr_local._4_4_ =
                           ref_cell_add(pRVar1->cell[3],&node,&ref_private_macro_code_rss);
                      if (ref_grid_ptr_local._4_4_ == 0) {
                        _node = 0x300000004;
                        nodes[0] = 2;
                        nodes[1] = 0x14;
                        ref_grid_ptr_local._4_4_ =
                             ref_cell_add(pRVar1->cell[3],&node,&ref_private_macro_code_rss);
                        if (ref_grid_ptr_local._4_4_ == 0) {
                          _node = 0x200000000;
                          nodes[0] = 3;
                          nodes[1] = 0x14;
                          ref_grid_ptr_local._4_4_ =
                               ref_cell_add(pRVar1->cell[3],&node,&ref_private_macro_code_rss);
                          if (ref_grid_ptr_local._4_4_ == 0) {
                            ref_grid_ptr_local._4_4_ = 0;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                   ,0x15b,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,
                                   "add tri");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                 ,0x155,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,
                                 "add tri");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                               ,0x14f,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,
                               "add tri");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                             ,0x149,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add tri"
                            );
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x143,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add qua");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                         ,0x13c,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add pyr");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x13a,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x135,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x130,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,299,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x126,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x121,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x11d
           ,"ref_fixture_pyr_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pyr_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[5] = {0, 1, 2, 3, 4};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_initialize_n_global(ref_node, 5), "init glob");

  RSS(ref_cell_add(ref_grid_pyr(ref_grid), nodes, &cell), "add pyr");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 4;
  nodes[3] = 1;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add qua");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 1;
  nodes[1] = 4;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 4;
  nodes[1] = 3;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 0;
  nodes[1] = 2;
  nodes[2] = 3;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  return REF_SUCCESS;
}